

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O0

void __thiscall Array1dTest_AccessConst_Test::TestBody(Array1dTest_AccessConst_Test *this)

{
  bool bVar1;
  ValueType_conflict1 *actual_expression;
  AssertionResult gtest_ar;
  int i;
  Array1d<int> a;
  int in_stack_ffffffffffffff7c;
  Array1d<int> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffa0;
  ValueType_conflict1 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  Type in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  IndexType_conflict1 in_stack_ffffffffffffffb4;
  AssertionResult local_38;
  int iVar3;
  Vector1<int> in_stack_ffffffffffffffdc;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  pica::Vector1<int>::Vector1((Vector1<int> *)&stack0xffffffffffffffdc,5);
  pica::Array1d<int>::Array1d
            ((Array1d<int> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa4);
  for (iVar3 = 0; iVar3 < 5; iVar3 = iVar3 + 1) {
    actual_expression =
         pica::Array1d<int>::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (char *)actual_expression,
               (int *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
               (int *)in_stack_ffffffffffffff80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
    in_stack_ffffffffffffff8f = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_ffffffffffffffb4.x,in_stack_ffffffffffffffb0));
      in_stack_ffffffffffffff80 =
           (Array1d<int> *)testing::AssertionResult::failure_message((AssertionResult *)0x229a20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffb4.x,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,(char *)actual_expression);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffe0,(Message *)CONCAT44(in_stack_ffffffffffffffdc.x,iVar3));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff80);
      testing::Message::~Message((Message *)0x229a6e);
    }
    uVar2 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x229abe);
    if (uVar2 != 0) break;
    in_stack_ffffffffffffff9c = 0;
  }
  pica::Array1d<int>::~Array1d((Array1d<int> *)0x229af8);
  return;
}

Assistant:

TEST(Array1dTest, AccessConst)
{
    const Array1d<int> a(5, 2);
    for (int i = 0; i < 5; i++)
        ASSERT_EQ(2, a(i));
}